

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O0

int comex_put(void *src,void *dst,int bytes,int proc,comex_group_t group)

{
  int iVar1;
  int in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  int in_R8D;
  int world_proc;
  int ierr;
  int size;
  int local_20;
  
  iVar1 = comex_group_size((comex_group_t)((ulong)in_RSI >> 0x20),(int *)CONCAT44(in_EDX,in_ECX));
  if (iVar1 != 0) {
    __assert_fail("COMEX_SUCCESS == ierr",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x260,"int comex_put(void *, void *, int, int, comex_group_t)");
  }
  if (-1 < in_ECX) {
    if (in_ECX < local_20) {
      if (in_R8D != 0) {
        comex_group_translate_world
                  ((comex_group_t)((ulong)in_RSI >> 0x20),(int)in_RSI,(int *)CONCAT44(in_EDX,in_ECX)
                  );
      }
      _put_nbi(dst,(void *)CONCAT44(bytes,proc),group,size);
      comex_wait_proc(0,0x1cef16);
      return 0;
    }
    __assert_fail("proc < size",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x260,"int comex_put(void *, void *, int, int, comex_group_t)");
  }
  __assert_fail("proc >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                ,0x260,"int comex_put(void *, void *, int, int, comex_group_t)");
}

Assistant:

int comex_put(void *src, void *dst, int bytes, int proc, comex_group_t group)
{
    CHECK_GROUP(group,proc);
#if DEBUG
    printf("[%d] comex_put(src=%p, dst=%p, bytes=%d, proc=%d, group=%d)\n",
            l_state.rank, src, dst, bytes, proc, group);
#endif
    _put_nbi(src, dst, bytes, proc);
    comex_wait_proc(proc, group);
    return COMEX_SUCCESS;
}